

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_6_2_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  float *data;
  int scale;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  int c2;
  int iVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  float *pfVar48;
  int iVar49;
  float *pfVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  int iVar54;
  float *pfVar55;
  int k_count;
  long lVar56;
  long lVar57;
  long lVar58;
  int c1;
  int iVar59;
  int iVar60;
  long lVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  float *pfVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 auVar104 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [64];
  int data_width;
  int local_184;
  
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar103 = ZEXT1664(auVar75);
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  fVar82 = ipoint->scale;
  auVar108 = ZEXT464((uint)fVar82);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar82),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  fVar80 = -0.08 / (fVar82 * fVar82);
  scale = (int)auVar67._0_4_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar82;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  fVar107 = auVar72._0_4_ - auVar67._0_4_;
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  fVar8 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar82),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar82);
  if (scale < (int)auVar67._0_4_) {
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (scale < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + scale <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar18._8_4_ = 0x80000000;
        auVar18._0_8_ = 0x8000000080000000;
        auVar18._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar18,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar48 = iimage->data;
          fVar8 = fVar8 + 0.5;
          pfVar55 = haarResponseY + 0x79;
          pfVar65 = haarResponseX + 0x79;
          iVar42 = scale * 2;
          uVar28 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar28;
            auVar104 = in_ZMM8._4_12_;
            auVar67._4_12_ = auVar104;
            auVar96._0_4_ = (float)(int)(uVar28 | 1);
            auVar96._4_12_ = auVar104;
            auVar100._0_4_ = (float)(int)(uVar28 + 2);
            auVar100._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)fVar8));
            auVar69 = vfmadd213ss_fma(auVar96,auVar68,ZEXT416((uint)fVar8));
            auVar71 = ZEXT416((uint)fVar8);
            auVar70 = vfmadd213ss_fma(auVar100,auVar68,auVar71);
            iVar23 = (int)auVar67._0_4_;
            iVar24 = (int)auVar69._0_4_;
            auVar97._0_4_ = (float)(int)(uVar28 + 3);
            auVar97._4_12_ = auVar104;
            iVar25 = (int)auVar70._0_4_;
            auVar101._0_4_ = (float)(int)(uVar28 + 4);
            auVar101._4_12_ = auVar104;
            auVar67 = vfmadd213ss_fma(auVar97,auVar68,auVar71);
            auVar69 = vfmadd213ss_fma(auVar101,auVar68,auVar71);
            iVar53 = (iVar23 + -1) * iVar1;
            iVar44 = (iVar23 + -1 + iVar42) * iVar1;
            iVar26 = (int)auVar67._0_4_;
            auVar98._0_4_ = (float)(int)(uVar28 + 5);
            auVar98._4_12_ = auVar104;
            iVar27 = (int)auVar69._0_4_;
            lVar57 = 0;
            auVar67 = vfmadd213ss_fma(auVar98,auVar68,auVar71);
            iVar45 = (iVar24 + -1 + iVar42) * iVar1;
            iVar23 = (iVar23 + -1 + scale) * iVar1;
            iVar41 = (iVar24 + -1) * iVar1;
            iVar24 = (iVar24 + -1 + scale) * iVar1;
            iVar33 = (iVar25 + -1) * iVar1;
            iVar43 = (iVar25 + -1 + iVar42) * iVar1;
            iVar25 = (iVar25 + -1 + scale) * iVar1;
            iVar34 = (iVar26 + -1 + iVar42) * iVar1;
            iVar39 = (iVar26 + -1) * iVar1;
            iVar62 = (iVar27 + -1 + iVar42) * iVar1;
            iVar26 = (iVar26 + -1 + scale) * iVar1;
            iVar36 = (iVar27 + -1) * iVar1;
            iVar27 = (iVar27 + -1 + scale) * iVar1;
            iVar31 = (int)auVar67._0_4_;
            iVar32 = (iVar31 + -1) * iVar1;
            iVar35 = (iVar31 + -1 + scale) * iVar1;
            iVar31 = (iVar31 + -1 + iVar42) * iVar1;
            do {
              iVar54 = (int)lVar57 + -0xc;
              auVar93._0_4_ = (float)iVar54;
              auVar93._4_12_ = auVar75._4_12_;
              auVar67 = vfmadd213ss_fma(auVar93,auVar68,ZEXT416((uint)(fVar107 + 0.5)));
              iVar49 = (int)auVar67._0_4_;
              auVar94._0_4_ = (float)((int)lVar57 + -0xb);
              auVar94._4_12_ = auVar75._4_12_;
              auVar67 = vfmadd213ss_fma(auVar94,auVar68,ZEXT416((uint)(fVar107 + 0.5)));
              iVar63 = iVar49 + -1 + iVar42;
              iVar60 = iVar49 + -1 + scale;
              iVar59 = (int)auVar67._0_4_;
              fVar82 = pfVar48[iVar44 + -1 + iVar49];
              fVar81 = pfVar48[iVar53 + iVar63];
              iVar47 = iVar59 + -1 + iVar42;
              auVar70 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar23 + -1 + iVar49] -
                                                      pfVar48[iVar23 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar44 + iVar63] -
                                                      pfVar48[iVar53 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar53 + iVar60] -
                                                      pfVar48[iVar44 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar44 + iVar63] -
                                                      pfVar48[iVar53 + -1 + iVar49])));
              pfVar65[lVar57 + -0x79] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar55[lVar57 + -0x79] = auVar67._0_4_ - (fVar82 - fVar81);
              iVar64 = iVar59 + -1 + scale;
              fVar82 = pfVar48[iVar44 + -1 + iVar59];
              fVar81 = pfVar48[iVar53 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar53 + iVar64] -
                                                      pfVar48[iVar44 + iVar64])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar44 + iVar47] -
                                                      pfVar48[iVar53 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar23 + -1 + iVar59] -
                                                      pfVar48[iVar23 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar44 + iVar47] -
                                                      pfVar48[iVar53 + -1 + iVar59])));
              pfVar65[lVar57 + -0x78] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -0x78] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar45 + -1 + iVar49];
              fVar81 = pfVar48[iVar41 + iVar63];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar24 + -1 + iVar49] -
                                                      pfVar48[iVar24 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar45 + iVar63] -
                                                      pfVar48[iVar41 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar41 + iVar60] -
                                                      pfVar48[iVar45 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar45 + iVar63] -
                                                      pfVar48[iVar41 + -1 + iVar49])));
              pfVar65[lVar57 + -0x61] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar55[lVar57 + -0x61] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar45 + -1 + iVar59];
              fVar81 = pfVar48[iVar41 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar41 + iVar64] -
                                                      pfVar48[iVar45 + iVar64])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar45 + iVar47] -
                                                      pfVar48[iVar41 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar24 + -1 + iVar59] -
                                                      pfVar48[iVar24 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar45 + iVar47] -
                                                      pfVar48[iVar41 + -1 + iVar59])));
              pfVar65[lVar57 + -0x60] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -0x60] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar43 + -1 + iVar49];
              fVar81 = pfVar48[iVar33 + iVar63];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar25 + -1 + iVar49] -
                                                      pfVar48[iVar25 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar43 + iVar63] -
                                                      pfVar48[iVar33 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar33 + iVar60] -
                                                      pfVar48[iVar43 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar43 + iVar63] -
                                                      pfVar48[iVar33 + -1 + iVar49])));
              pfVar65[lVar57 + -0x49] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar55[lVar57 + -0x49] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar43 + -1 + iVar59];
              fVar81 = pfVar48[iVar33 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar33 + iVar64] -
                                                      pfVar48[iVar43 + iVar64])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar43 + iVar47] -
                                                      pfVar48[iVar33 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar25 + -1 + iVar59] -
                                                      pfVar48[iVar25 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar43 + iVar47] -
                                                      pfVar48[iVar33 + -1 + iVar59])));
              pfVar65[lVar57 + -0x48] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -0x48] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar34 + -1 + iVar49];
              fVar81 = pfVar48[iVar39 + iVar63];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + -1 + iVar49] -
                                                      pfVar48[iVar26 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar63] -
                                                      pfVar48[iVar39 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar60] -
                                                      pfVar48[iVar34 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar63] -
                                                      pfVar48[iVar39 + -1 + iVar49])));
              pfVar65[lVar57 + -0x31] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar55[lVar57 + -0x31] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar34 + -1 + iVar59];
              fVar81 = pfVar48[iVar39 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar64] -
                                                      pfVar48[iVar34 + iVar64])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar47] -
                                                      pfVar48[iVar39 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + -1 + iVar59] -
                                                      pfVar48[iVar26 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar47] -
                                                      pfVar48[iVar39 + -1 + iVar59])));
              pfVar65[lVar57 + -0x30] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -0x30] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar62 + -1 + iVar49];
              fVar81 = pfVar48[iVar36 + iVar63];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar27 + -1 + iVar49] -
                                                      pfVar48[iVar27 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar62 + iVar63] -
                                                      pfVar48[iVar36 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar36 + iVar60] -
                                                      pfVar48[iVar62 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar62 + iVar63] -
                                                      pfVar48[iVar36 + -1 + iVar49])));
              pfVar65[lVar57 + -0x19] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar55[lVar57 + -0x19] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar62 + -1 + iVar59];
              fVar81 = pfVar48[iVar36 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar36 + iVar64] -
                                                      pfVar48[iVar62 + iVar64])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar62 + iVar47] -
                                                      pfVar48[iVar36 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar27 + -1 + iVar59] -
                                                      pfVar48[iVar27 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar62 + iVar47] -
                                                      pfVar48[iVar36 + -1 + iVar59])));
              pfVar65[lVar57 + -0x18] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -0x18] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar31 + -1 + iVar49];
              fVar81 = pfVar48[iVar32 + iVar63];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar32 + iVar60] -
                                                      pfVar48[iVar60 + iVar31])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar63 + iVar31] -
                                                      pfVar48[iVar32 + -1 + iVar49])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar35 + -1 + iVar49] -
                                                      pfVar48[iVar35 + iVar63])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar63 + iVar31] -
                                                      pfVar48[iVar32 + -1 + iVar49])));
              pfVar65[lVar57 + -1] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57 + -1] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar48[iVar31 + -1 + iVar59];
              fVar81 = pfVar48[iVar32 + iVar47];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar32 + iVar64] -
                                                      pfVar48[iVar64 + iVar31])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar47 + iVar31] -
                                                      pfVar48[iVar32 + -1 + iVar59])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar35 + -1 + iVar59] -
                                                      pfVar48[iVar35 + iVar47])),auVar70,
                                        ZEXT416((uint)(pfVar48[iVar47 + iVar31] -
                                                      pfVar48[iVar32 + -1 + iVar59])));
              pfVar65[lVar57] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar55[lVar57] = auVar69._0_4_ - (fVar82 - fVar81);
              lVar57 = lVar57 + 2;
            } while (iVar54 < 10);
            pfVar55 = pfVar55 + 0x90;
            pfVar65 = pfVar65 + 0x90;
            bVar3 = (int)uVar28 < 6;
            uVar28 = uVar28 + 6;
          } while (bVar3);
          goto LAB_0025d3d3;
        }
      }
    }
  }
  lVar57 = 0;
  iVar1 = scale * 2;
  uVar28 = 0xfffffff4;
  do {
    auVar67 = vpbroadcastd_avx512vl();
    auVar67 = vpaddd_avx(auVar67,_DAT_00599790);
    auVar86._0_4_ = (float)(int)uVar28;
    auVar86._4_12_ = in_ZMM8._4_12_;
    auVar90._0_4_ = (float)(int)(uVar28 | 1);
    auVar90._4_12_ = in_ZMM8._4_12_;
    auVar69 = vfmadd213ss_fma(auVar86,auVar108._0_16_,ZEXT416((uint)fVar8));
    auVar70 = vfmadd213ss_fma(auVar90,auVar108._0_16_,ZEXT416((uint)fVar8));
    fVar81 = auVar69._0_4_;
    fVar88 = auVar70._0_4_;
    iVar62 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
    auVar67 = vcvtdq2ps_avx(auVar67);
    iVar24 = (int)((double)((ulong)(0.0 <= fVar88) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar88) * -0x4020000000000000) + (double)fVar88);
    auVar21._4_4_ = fVar8;
    auVar21._0_4_ = fVar8;
    auVar21._8_4_ = fVar8;
    auVar21._12_4_ = fVar8;
    auVar22._4_4_ = fVar82;
    auVar22._0_4_ = fVar82;
    auVar22._8_4_ = fVar82;
    auVar22._12_4_ = fVar82;
    auVar67 = vfmadd132ps_fma(auVar67,auVar21,auVar22);
    uVar29 = vcmpps_avx512vl(auVar67,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar67);
    auVar85._8_8_ = 0xbfe0000000000000;
    auVar85._0_8_ = 0xbfe0000000000000;
    auVar85._16_8_ = 0xbfe0000000000000;
    auVar85._24_8_ = 0xbfe0000000000000;
    auVar79._12_4_ = 0x3fe00000;
    auVar79._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar79._16_8_ = 0x3fe0000000000000;
    auVar79._24_8_ = 0x3fe0000000000000;
    auVar79 = vblendmpd_avx512vl(auVar85,auVar79);
    bVar3 = (bool)((byte)uVar29 & 1);
    bVar4 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar29 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
    iVar31 = iVar62 + -1 + scale;
    iVar32 = iVar1 + -1 + iVar62;
    auVar83._0_4_ =
         (int)((double)((ulong)bVar3 * auVar79._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar83._4_4_ =
         (int)((double)((ulong)bVar4 * auVar79._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar83._8_4_ =
         (int)((double)((ulong)bVar5 * auVar79._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar83._12_4_ =
         (int)((double)((ulong)bVar6 * auVar79._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar19._8_4_ = 1;
    auVar19._0_8_ = 0x100000001;
    auVar19._12_4_ = 1;
    uVar29 = vpcmpd_avx512vl(auVar83,auVar19,1);
    uVar66 = uVar29 & 0xf;
    iVar33 = iVar24 + -1 + scale;
    iVar34 = iVar1 + -1 + iVar24;
    iVar43 = iVar1 + -1 + auVar83._12_4_;
    iVar25 = auVar83._12_4_ + -1 + scale;
    iVar35 = auVar83._8_4_ + -1 + scale;
    iVar26 = iVar1 + -1 + auVar83._8_4_;
    iVar36 = auVar83._4_4_ + -1 + scale;
    iVar27 = iVar1 + -1 + auVar83._4_4_;
    iVar23 = auVar83._0_4_ + -1 + scale;
    iVar41 = iVar1 + -1 + auVar83._0_4_;
    pfVar48 = haarResponseX;
    pfVar65 = haarResponseY;
    lVar56 = lVar57;
    iVar42 = -0xc;
    do {
      auVar84._0_4_ = (float)iVar42;
      auVar84._4_12_ = auVar103._4_12_;
      auVar67 = vfmadd213ss_fma(auVar84,auVar108._0_16_,ZEXT416((uint)fVar107));
      auVar99._0_4_ = (float)(iVar42 + 1);
      auVar99._4_12_ = auVar103._4_12_;
      auVar69 = vfmadd213ss_fma(auVar99,auVar108._0_16_,ZEXT416((uint)fVar107));
      fVar81 = auVar67._0_4_;
      fVar88 = auVar69._0_4_;
      iVar39 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
      if (((iVar62 < 1) || (iVar39 < 1)) || (iimage->height < iVar1 + iVar62)) {
LAB_0025c490:
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar62,iVar39,scale,(float *)((long)pfVar48 + lVar56),
               (float *)((long)pfVar65 + lVar56));
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar53 = iimage->width;
        iVar44 = iVar1 + iVar39;
        if (iVar53 < iVar44) goto LAB_0025c490;
        iVar45 = iimage->data_width;
        pfVar55 = iimage->data;
        iVar59 = iVar39 + -1 + scale;
        iVar54 = iVar45 * (iVar62 + -1);
        iVar64 = iVar45 * iVar31;
        iVar45 = iVar45 * iVar32;
        fVar81 = pfVar55[iVar45 + -1 + iVar39];
        fVar9 = pfVar55[iVar54 + -1 + iVar44];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar55[iVar54 + iVar59] - pfVar55[iVar45 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar55[iVar45 + -1 + iVar44] -
                                                pfVar55[iVar54 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar55[iVar64 + -1 + iVar39] -
                                                pfVar55[iVar64 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar55[iVar45 + -1 + iVar44] -
                                                pfVar55[iVar54 + -1 + iVar39])));
        *(float *)((long)pfVar48 + lVar56) = (fVar81 - fVar9) + auVar67._0_4_;
        *(float *)((long)pfVar65 + lVar56) = auVar69._0_4_ - (fVar81 - fVar9);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 4);
      pfVar50 = (float *)((long)pfVar65 + lVar56 + 4);
      iVar44 = (int)((double)((ulong)(0.0 <= fVar88) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar88) * -0x4020000000000000) + (double)fVar88);
      if (((iVar62 < 1) || (iVar44 < 1)) ||
         ((iimage->height < iVar1 + iVar62 || (iVar45 = iVar1 + iVar44, iVar53 < iVar45)))) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar62,iVar44,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (iVar62 + -1);
        iVar64 = iVar44 + -1 + scale;
        iVar63 = iVar54 * iVar31;
        iVar54 = iVar54 * iVar32;
        fVar81 = pfVar2[iVar54 + -1 + iVar44];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar44] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x60);
      pfVar50 = (float *)((long)pfVar65 + lVar56 + 0x60);
      if (((iVar24 < 1) || (iVar39 < 1)) ||
         ((iimage->height < iVar1 + iVar24 || (iVar45 = iVar1 + iVar39, iVar53 < iVar45)))) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar24,iVar39,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (iVar24 + -1);
        iVar64 = iVar39 + -1 + scale;
        iVar63 = iVar54 * iVar33;
        iVar54 = iVar54 * iVar34;
        fVar81 = pfVar2[iVar54 + -1 + iVar39];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar39] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 100);
      pfVar50 = (float *)((long)pfVar65 + lVar56 + 100);
      if ((((iVar24 < 1) || (iVar44 < 1)) || (iimage->height < iVar1 + iVar24)) ||
         (iVar45 = iVar1 + iVar44, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar24,iVar44,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar44 + -1 + scale;
        iVar59 = iVar54 * (iVar24 + -1);
        iVar63 = iVar54 * iVar33;
        iVar54 = iVar54 * iVar34;
        fVar81 = pfVar2[iVar54 + -1 + iVar44];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar44] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0xc0);
      pfVar50 = (float *)(lVar56 + 0xc0 + (long)pfVar65);
      if (((iVar39 < 1 || uVar66 >> 3 != 0) || (iimage->height < iVar1 + auVar83._12_4_)) ||
         (iVar45 = iVar1 + iVar39, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar39,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._12_4_ + -1);
        iVar64 = iVar39 + -1 + scale;
        iVar63 = iVar54 * iVar25;
        iVar54 = iVar54 * iVar43;
        fVar81 = pfVar2[iVar54 + -1 + iVar39];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar39] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0xc4);
      pfVar50 = (float *)(lVar56 + 0xc4 + (long)pfVar65);
      if (((iVar44 < 1 || uVar66 >> 3 != 0) || (iimage->height < iVar1 + auVar83._12_4_)) ||
         (iVar45 = iVar1 + iVar44, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar44,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._12_4_ + -1);
        iVar64 = iVar44 + -1 + scale;
        iVar63 = iVar54 * iVar25;
        iVar54 = iVar54 * iVar43;
        fVar81 = pfVar2[iVar54 + -1 + iVar44];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar44] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x120);
      pfVar50 = (float *)(lVar56 + 0x120 + (long)pfVar65);
      if (((iVar39 < 1 || (uVar66 >> 2 & 1) != 0) || (iimage->height < iVar1 + auVar83._8_4_)) ||
         (iVar45 = iVar1 + iVar39, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar39,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._8_4_ + -1);
        iVar64 = iVar39 + -1 + scale;
        iVar63 = iVar54 * iVar35;
        iVar54 = iVar54 * iVar26;
        fVar81 = pfVar2[iVar54 + -1 + iVar39];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar39] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x124);
      pfVar50 = (float *)(lVar56 + 0x124 + (long)pfVar65);
      if (((iVar44 < 1 || (uVar66 >> 2 & 1) != 0) || (iimage->height < iVar1 + auVar83._8_4_)) ||
         (iVar45 = iVar1 + iVar44, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar44,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._8_4_ + -1);
        iVar64 = iVar44 + -1 + scale;
        iVar63 = iVar54 * iVar35;
        iVar54 = iVar54 * iVar26;
        fVar81 = pfVar2[iVar54 + -1 + iVar44];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar44] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x180);
      pfVar50 = (float *)(lVar56 + 0x180 + (long)pfVar65);
      if (((iVar39 < 1 || (uVar66 >> 1 & 1) != 0) || (iimage->height < iVar1 + auVar83._4_4_)) ||
         (iVar45 = iVar1 + iVar39, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar39,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._4_4_ + -1);
        iVar64 = iVar39 + -1 + scale;
        iVar63 = iVar54 * iVar36;
        iVar54 = iVar54 * iVar27;
        fVar81 = pfVar2[iVar54 + -1 + iVar39];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar39] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar39])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x184);
      pfVar50 = (float *)(lVar56 + 0x184 + (long)pfVar65);
      if (((iVar44 < 1 || (uVar66 >> 1 & 1) != 0) || (iimage->height < iVar1 + auVar83._4_4_)) ||
         (iVar45 = iVar1 + iVar44, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar44,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar54 * (auVar83._4_4_ + -1);
        iVar64 = iVar44 + -1 + scale;
        iVar63 = iVar54 * iVar36;
        iVar54 = iVar54 * iVar27;
        fVar81 = pfVar2[iVar54 + -1 + iVar44];
        fVar88 = pfVar2[iVar59 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar44] -
                                                pfVar2[iVar63 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar59 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x1e0);
      pfVar50 = (float *)(lVar56 + 0x1e0 + (long)pfVar65);
      if (((iVar39 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar1 + auVar83._0_4_)) ||
         (iVar45 = iVar1 + iVar39, iVar53 < iVar45)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar39,scale,pfVar55,pfVar50);
        iVar53 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar54 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar63 = iVar54 * (auVar83._0_4_ + -1);
        iVar64 = iVar39 + -1 + scale;
        iVar59 = iVar54 * iVar23;
        iVar54 = iVar54 * iVar41;
        fVar81 = pfVar2[iVar54 + -1 + iVar39];
        fVar88 = pfVar2[iVar63 + -1 + iVar45];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar64] - pfVar2[iVar54 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar63 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar39] -
                                                pfVar2[iVar59 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar45] -
                                                pfVar2[iVar63 + -1 + iVar39])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      pfVar55 = (float *)((long)pfVar48 + lVar56 + 0x1e4);
      pfVar50 = (float *)(lVar56 + 0x1e4 + (long)pfVar65);
      if (((iVar44 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar1 + auVar83._0_4_)) ||
         (iVar39 = iVar1 + iVar44, iVar53 < iVar39)) {
        auVar103 = ZEXT1664(auVar103._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar44,scale,pfVar55,pfVar50);
        pfVar48 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar53 = iimage->data_width;
        iVar54 = iVar53 * (auVar83._0_4_ + -1);
        iVar45 = iVar44 + -1 + scale;
        pfVar2 = iimage->data;
        iVar64 = iVar53 * iVar23;
        iVar53 = iVar53 * iVar41;
        fVar81 = pfVar2[iVar53 + -1 + iVar44];
        fVar88 = pfVar2[iVar54 + -1 + iVar39];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar54 + iVar45] - pfVar2[iVar53 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar53 + -1 + iVar39] -
                                                pfVar2[iVar54 + -1 + iVar44])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar64 + -1 + iVar44] -
                                                pfVar2[iVar64 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar53 + -1 + iVar39] -
                                                pfVar2[iVar54 + -1 + iVar44])));
        *pfVar55 = (fVar81 - fVar88) + auVar67._0_4_;
        *pfVar50 = auVar69._0_4_ - (fVar81 - fVar88);
      }
      auVar108 = ZEXT1664(auVar68);
      lVar56 = lVar56 + 8;
      bVar3 = iVar42 < 10;
      iVar42 = iVar42 + 2;
    } while (bVar3);
    lVar57 = lVar57 + 0x240;
    bVar3 = (int)uVar28 < 6;
    uVar28 = uVar28 + 6;
  } while (bVar3);
LAB_0025d3d3:
  fVar107 = auVar108._0_4_;
  auVar106._8_4_ = 0x3effffff;
  auVar106._0_8_ = 0x3effffff3effffff;
  auVar106._12_4_ = 0x3effffff;
  auVar105._8_4_ = 0x80000000;
  auVar105._0_8_ = 0x8000000080000000;
  auVar105._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 0.5)),auVar105,0xf8);
  auVar67 = ZEXT416((uint)(fVar107 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 1.5)),auVar105,0xf8);
  auVar68 = ZEXT416((uint)(fVar107 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 2.5)),auVar105,0xf8);
  auVar69 = ZEXT416((uint)(fVar107 * 2.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 3.5)),auVar105,0xf8);
  auVar70 = ZEXT416((uint)(fVar107 * 3.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 4.5)),auVar105,0xf8);
  auVar71 = ZEXT416((uint)(fVar107 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 5.5)),auVar105,0xf8);
  auVar72 = ZEXT416((uint)(fVar107 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 6.5)),auVar105,0xf8);
  auVar73 = ZEXT416((uint)(fVar107 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 7.5)),auVar105,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar107 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 8.5)),auVar105,0xf8);
  auVar75 = ZEXT416((uint)(fVar107 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 9.5)),auVar105,0xf8);
  auVar76 = ZEXT416((uint)(fVar107 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 10.5)),auVar105,0xf8);
  auVar77 = ZEXT416((uint)(fVar107 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 11.5)),auVar105,0xf8);
  fVar89 = auVar69._0_4_;
  fVar82 = fVar89 + auVar68._0_4_;
  fVar8 = fVar89 + auVar67._0_4_;
  auVar69 = ZEXT416((uint)(fVar107 * 11.5 + auVar78._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  fVar107 = fVar89 - auVar67._0_4_;
  fVar81 = fVar89 - auVar68._0_4_;
  fVar88 = fVar89 - auVar70._0_4_;
  fVar9 = fVar89 - auVar71._0_4_;
  fVar10 = fVar89 - auVar72._0_4_;
  fVar89 = fVar89 - auVar73._0_4_;
  fVar102 = auVar74._0_4_;
  fVar11 = fVar102 - auVar70._0_4_;
  fVar12 = fVar102 - auVar71._0_4_;
  fVar13 = fVar102 - auVar72._0_4_;
  fVar14 = fVar102 - auVar73._0_4_;
  fVar15 = fVar102 - auVar75._0_4_;
  fVar16 = fVar102 - auVar76._0_4_;
  fVar17 = fVar102 - auVar77._0_4_;
  fVar102 = fVar102 - auVar69._0_4_;
  gauss_s1_c0[0] = expf(fVar82 * fVar82 * fVar80);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar80);
  gauss_s1_c0[2] = expf(fVar107 * fVar107 * fVar80);
  gauss_s1_c0[3] = expf(fVar81 * fVar81 * fVar80);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar88 * fVar88 * fVar80);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar80);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar80);
  gauss_s1_c0[8] = expf(fVar89 * fVar89 * fVar80);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar80);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar80);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar80);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar80);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar80);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar80);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar80);
  gauss_s1_c1[8] = expf(fVar102 * fVar102 * fVar80);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  uVar29 = 0xfffffff8;
  fVar82 = 0.0;
  lVar57 = 0;
  lVar56 = 0;
  local_184 = 0;
  do {
    pfVar48 = gauss_s1_c1;
    uVar28 = (uint)uVar29;
    if (uVar28 != 7) {
      pfVar48 = gauss_s1_c0;
    }
    lVar58 = (long)local_184;
    lVar56 = (long)(int)lVar56;
    if (uVar28 == 0xfffffff8) {
      pfVar48 = gauss_s1_c1;
    }
    uVar66 = 0;
    local_184 = local_184 + 4;
    uVar46 = 0xfffffff8;
    lVar51 = (long)haarResponseX + lVar57;
    lVar38 = (long)haarResponseY + lVar57;
    do {
      pfVar65 = gauss_s1_c1;
      if (uVar46 != 7) {
        pfVar65 = gauss_s1_c0;
      }
      auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar46 == 0xfffffff8) {
        pfVar65 = gauss_s1_c1;
      }
      uVar30 = (ulong)(uVar46 >> 0x1c & 0xfffffff8);
      uVar37 = uVar66;
      lVar40 = lVar38;
      lVar61 = lVar51;
      do {
        lVar52 = 0;
        pfVar55 = (float *)((long)pfVar48 + (ulong)(uint)((int)(uVar29 >> 0x1f) << 5));
        do {
          fVar8 = pfVar65[uVar30] * *pfVar55;
          pfVar55 = pfVar55 + (ulong)(~uVar28 >> 0x1f) * 2 + -1;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar40 + lVar52 * 4)),
                                  ZEXT416(*(uint *)(lVar61 + lVar52 * 4)),0x10);
          lVar52 = lVar52 + 1;
          auVar95._0_4_ = fVar8 * auVar67._0_4_;
          auVar95._4_4_ = fVar8 * auVar67._4_4_;
          auVar95._8_4_ = fVar8 * auVar67._8_4_;
          auVar95._12_4_ = fVar8 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar95,auVar87);
          auVar67 = vmovlhps_avx(auVar95,auVar67);
          auVar91._0_4_ = auVar103._0_4_ + auVar67._0_4_;
          auVar91._4_4_ = auVar103._4_4_ + auVar67._4_4_;
          auVar91._8_4_ = auVar103._8_4_ + auVar67._8_4_;
          auVar91._12_4_ = auVar103._12_4_ + auVar67._12_4_;
          auVar103 = ZEXT1664(auVar91);
        } while (lVar52 != 9);
        uVar37 = uVar37 + 0x18;
        uVar30 = uVar30 + (ulong)(-1 < (int)uVar46) * 2 + -1;
        lVar61 = lVar61 + 0x60;
        lVar40 = lVar40 + 0x60;
      } while (uVar37 < uVar46 * 0x18 + 0x198);
      uVar46 = uVar46 + 5;
      uVar66 = uVar66 + 0x78;
      fVar8 = gauss_s2_arr[lVar58];
      auVar20._4_4_ = fVar8;
      auVar20._0_4_ = fVar8;
      auVar20._8_4_ = fVar8;
      auVar20._12_4_ = fVar8;
      auVar70 = vmulps_avx512vl(auVar91,auVar20);
      lVar58 = lVar58 + 1;
      auVar92._0_4_ = auVar70._0_4_ * auVar70._0_4_;
      auVar92._4_4_ = auVar70._4_4_ * auVar70._4_4_;
      auVar92._8_4_ = auVar70._8_4_ * auVar70._8_4_;
      auVar92._12_4_ = auVar70._12_4_ * auVar70._12_4_;
      auVar68 = vshufpd_avx(auVar70,auVar70,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar56) = auVar70;
      lVar56 = lVar56 + 4;
      lVar51 = lVar51 + 0x1e0;
      lVar38 = lVar38 + 0x1e0;
      auVar67 = vmovshdup_avx(auVar92);
      auVar69 = vfmadd231ss_fma(auVar67,auVar70,auVar70);
      auVar67 = vshufps_avx(auVar70,auVar70,0xff);
      auVar68 = vfmadd213ss_fma(auVar68,auVar68,auVar69);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar82 = fVar82 + auVar67._0_4_;
    } while (local_184 != (int)lVar58);
    lVar57 = lVar57 + 0x14;
    uVar29 = (ulong)(uVar28 + 5);
  } while ((int)uVar28 < 3);
  if (fVar82 < 0.0) {
    fVar82 = sqrtf(fVar82);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar82 = auVar67._0_4_;
  }
  lVar57 = 0;
  auVar103 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar82)));
  do {
    auVar108 = vmulps_avx512f(auVar103,*(undefined1 (*) [64])(ipoint->descriptor + lVar57));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar57) = auVar108;
    lVar57 = lVar57 + 0x10;
  } while (lVar57 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_2_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}